

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void libserver::multiple_client_handler(void)

{
  bind_t<bool,_boost::_mfi::cmf0<bool,_libserver::server>,_boost::_bi::list1<boost::arg<1>_>_>
  __pred;
  bool bVar1;
  reference r;
  type this;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  local_c0;
  const_iterator local_b8;
  code *local_b0;
  undefined8 local_a8;
  F local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  local_80;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  local_78;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_60 [8];
  scoped_lock lk;
  undefined1 local_40 [8];
  shared_ptr<libserver::server> b;
  iterator __end2;
  iterator __begin2;
  server_ptr_vector *__range2;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_10;
  
  do {
    __range2._4_4_ = 1;
    boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
    subsecond_duration<int>(&local_10,(int *)((long)&__range2 + 4),(type *)0x0);
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(&local_10);
    __end2 = std::
             vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
             ::begin(&server_shared_ptrs);
    b.pn.pi_ = (sp_counted_base *)
               std::
               vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
               ::end(&server_shared_ptrs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
                                  *)&b.pn);
      if (!bVar1) break;
      r = __gnu_cxx::
          __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
          ::operator*(&__end2);
      boost::shared_ptr<libserver::server>::shared_ptr((shared_ptr<libserver::server> *)local_40,r);
      this = boost::shared_ptr<libserver::server>::operator->
                       ((shared_ptr<libserver::server> *)local_40);
      server::handle_client(this);
      boost::shared_ptr<libserver::server>::~shared_ptr((shared_ptr<libserver::server> *)local_40);
      __gnu_cxx::
      __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
      ::operator++(&__end2);
    }
    boost::unique_lock<boost::recursive_mutex>::unique_lock
              ((unique_lock<boost::recursive_mutex> *)local_60,&cs);
    local_78._M_current =
         (shared_ptr<libserver::server> *)
         std::
         vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
         ::begin(&server_shared_ptrs);
    local_80._M_current =
         (shared_ptr<libserver::server> *)
         std::
         vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
         ::end(&server_shared_ptrs);
    local_b0 = server::_is_timed_out;
    local_a8 = 0;
    boost::bind<bool,libserver::server,boost::arg<1>>(&local_98,(boost *)server::_is_timed_out,0);
    __pred.f_._8_8_ = uStack_90;
    __pred.f_.f_ = local_98;
    __pred._16_8_ = local_88;
    local_70 = std::
               remove_if<__gnu_cxx::__normal_iterator<boost::shared_ptr<libserver::server>*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>,boost::_bi::bind_t<bool,boost::_mfi::cmf0<bool,libserver::server>,boost::_bi::list1<boost::arg<1>>>>
                         (local_78,local_80,__pred);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<libserver::server>const*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>
    ::__normal_iterator<boost::shared_ptr<libserver::server>*>
              ((__normal_iterator<boost::shared_ptr<libserver::server>const*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>
                *)&local_68,&local_70);
    local_c0._M_current =
         (shared_ptr<libserver::server> *)
         std::
         vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
         ::end(&server_shared_ptrs);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<libserver::server>const*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>
    ::__normal_iterator<boost::shared_ptr<libserver::server>*>
              ((__normal_iterator<boost::shared_ptr<libserver::server>const*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>
                *)&local_b8,&local_c0);
    std::
    vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
    ::erase(&server_shared_ptrs,local_68,local_b8);
    boost::unique_lock<boost::recursive_mutex>::~unique_lock
              ((unique_lock<boost::recursive_mutex> *)local_60);
  } while( true );
}

Assistant:

void libserver::multiple_client_handler()
{
    while ( true) {
        boost::this_thread::sleep( boost::posix_time::millisec(1));
        for (auto b:server_shared_ptrs) 
            (b)->handle_client();
        // erase clients that timed out
        boost::recursive_mutex::scoped_lock lk(cs);
        server_shared_ptrs.erase(std::remove_if(server_shared_ptrs.begin(), server_shared_ptrs.end(), 
                   boost::bind(&libserver::server::_is_timed_out,boost::placeholders::_1)), server_shared_ptrs.end());
    }
}